

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbify.cc
# Opt level: O3

base_learner * cbify_setup(options_i *options,vw *all)

{
  _func_int **pp_Var1;
  bool bVar2;
  undefined8 uVar3;
  byte bVar4;
  int iVar5;
  cbify *pcVar6;
  _func_int ***ppp_Var7;
  option_group_definition *poVar8;
  typed_option<float> *ptVar9;
  base_learner *pbVar10;
  multi_learner *base;
  learner<cbify,_example> *plVar11;
  single_learner *base_00;
  long lVar12;
  undefined **ppuVar13;
  label_parser *plVar14;
  parser *ppVar15;
  byte bVar16;
  float fVar17;
  float fVar18;
  bool use_cs;
  uint32_t num_actions;
  size_type __dnew_4;
  option_group_definition new_options;
  size_type __dnew_1;
  size_type __dnew;
  size_type __dnew_2;
  size_type __dnew_3;
  bool local_7a1;
  vw *local_7a0;
  uint local_794;
  float *local_790;
  cbify *local_788;
  _func_int ***local_780;
  _func_int **local_778;
  _func_int **local_770 [2];
  float *local_760;
  long local_758;
  _func_int ***local_750;
  _func_int **local_748;
  _func_int **local_740 [2];
  _func_int ***local_730;
  _func_int **local_728;
  _func_int **local_720 [2];
  _func_int ***local_710;
  _func_int **local_708;
  _func_int **local_700 [2];
  string local_6f0;
  string local_6d0;
  string local_6b0;
  option_group_definition local_690;
  undefined1 local_658 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_640;
  string local_628 [88];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_5d0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_5c0;
  long *local_5b8;
  long local_5b0;
  long local_5a8 [2];
  undefined1 local_598 [112];
  bool local_528;
  ios_base local_518 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_510;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_500;
  string local_410;
  typed_option<float> local_3f0;
  typed_option<float> local_350;
  typed_option<float> local_2b0;
  typed_option<float> local_210;
  typed_option<bool> local_170;
  typed_option<unsigned_int> local_d0;
  
  bVar16 = 0;
  local_794 = 0;
  local_7a0 = all;
  pcVar6 = calloc_or_throw<cbify>(1);
  local_788 = pcVar6;
  memset(pcVar6,0,0xd0);
  local_598._0_8_ = (_func_int **)0x26;
  local_780 = local_770;
  local_780 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_780,(ulong)local_598);
  local_770[0] = (_func_int **)local_598._0_8_;
  local_780[2] = (_func_int **)0x6e6f43206f746e69;
  local_780[3] = (_func_int **)0x206c617574786574;
  *local_780 = (_func_int **)0x6c754d20656b614d;
  local_780[1] = (_func_int **)0x207373616c636974;
  builtin_strncpy((char *)((long)local_780 + 0x1e),"l Bandit",8);
  local_778 = (_func_int **)local_598._0_8_;
  *(char *)((long)local_780 + local_598._0_8_) = '\0';
  local_690.m_name._M_dataplus._M_p = (pointer)&local_690.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_690,local_780,(char *)(local_598._0_8_ + (long)local_780));
  local_690.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_690.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_690.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_780 != local_770) {
    operator_delete(local_780);
  }
  local_6b0._M_dataplus._M_p = (pointer)&local_6b0.field_2;
  local_6b0.field_2._M_allocated_capacity._0_4_ = 0x66696263;
  local_6b0.field_2._M_allocated_capacity._4_2_ = 0x79;
  local_6b0._M_string_length = 5;
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)local_598,&local_6b0,&local_794);
  local_528 = true;
  local_710 = local_700;
  local_658._0_8_ = (_func_int **)0x42;
  ppp_Var7 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_710,(ulong)local_658);
  uVar3 = local_658._0_8_;
  local_700[0] = (_func_int **)local_658._0_8_;
  local_710 = ppp_Var7;
  memcpy(ppp_Var7,"Convert multiclass on <k> classes into a contextual bandit problem",0x42);
  local_708 = (_func_int **)uVar3;
  *(char *)((long)ppp_Var7 + uVar3) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_598 + 0x30));
  VW::config::typed_option<unsigned_int>::typed_option
            (&local_d0,(typed_option<unsigned_int> *)local_598);
  poVar8 = VW::config::option_group_definition::add<unsigned_int>(&local_690,&local_d0);
  local_6d0._M_dataplus._M_p = (pointer)&local_6d0.field_2;
  local_6d0.field_2._M_allocated_capacity = 0x73635f7966696263;
  local_6d0._M_string_length = 8;
  local_6d0.field_2._M_local_buf[8] = '\0';
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_658,&local_6d0,&local_7a1);
  local_730 = local_720;
  local_3f0.super_base_option._vptr_base_option = (_func_int **)0x44;
  ppp_Var7 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_730,(ulong)&local_3f0);
  pp_Var1 = local_3f0.super_base_option._vptr_base_option;
  local_720[0] = local_3f0.super_base_option._vptr_base_option;
  local_730 = ppp_Var7;
  memcpy(ppp_Var7,"consume cost-sensitive classification examples instead of multiclass",0x44);
  local_728 = pp_Var1;
  *(undefined1 *)((long)ppp_Var7 + (long)pp_Var1) = 0;
  std::__cxx11::string::_M_assign(local_628);
  VW::config::typed_option<bool>::typed_option(&local_170,(typed_option<bool> *)local_658);
  poVar8 = VW::config::option_group_definition::add<bool>(poVar8,&local_170);
  local_6f0._M_dataplus._M_p = (pointer)&local_6f0.field_2;
  local_6f0.field_2._M_allocated_capacity._0_4_ = 0x73736f6c;
  local_6f0.field_2._M_allocated_capacity._4_2_ = 0x30;
  local_6f0._M_string_length = 5;
  local_790 = &pcVar6->loss0;
  VW::config::typed_option<float>::typed_option(&local_3f0,&local_6f0,local_790);
  ptVar9 = VW::config::typed_option<float>::default_value(&local_3f0,0.0);
  local_750 = local_740;
  local_350.super_base_option._vptr_base_option = (_func_int **)0x16;
  local_750 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_750,(ulong)&local_350);
  local_740[0] = local_350.super_base_option._vptr_base_option;
  *local_750 = (_func_int **)0x726f662073736f6c;
  local_750[1] = (_func_int **)0x74636572726f6320;
  builtin_strncpy((char *)((long)local_750 + 0xe),"ct label",8);
  local_748 = local_350.super_base_option._vptr_base_option;
  *(char *)((long)local_750 + (long)local_350.super_base_option._vptr_base_option) = '\0';
  std::__cxx11::string::_M_assign((string *)&(ptVar9->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_210,ptVar9);
  poVar8 = VW::config::option_group_definition::add<float>(poVar8,&local_210);
  local_410.field_2._M_allocated_capacity._0_4_ = 0x73736f6c;
  local_410.field_2._M_allocated_capacity._4_2_ = 0x31;
  local_410._M_string_length = 5;
  local_760 = &pcVar6->loss1;
  local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
  VW::config::typed_option<float>::typed_option(&local_350,&local_410,local_760);
  ptVar9 = VW::config::typed_option<float>::default_value(&local_350,1.0);
  local_758 = 0x18;
  local_5b8 = local_5a8;
  local_5b8 = (long *)std::__cxx11::string::_M_create((ulong *)&local_5b8,(ulong)&local_758);
  local_5a8[0] = local_758;
  *local_5b8 = 0x726f662073736f6c;
  local_5b8[1] = 0x6572726f636e6920;
  local_5b8[2] = 0x6c6562616c207463;
  local_5b0 = local_758;
  *(char *)((long)local_5b8 + local_758) = '\0';
  std::__cxx11::string::_M_assign((string *)&(ptVar9->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_2b0,ptVar9);
  VW::config::option_group_definition::add<float>(poVar8,&local_2b0);
  local_2b0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cd238;
  if (local_2b0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_2b0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_2b0.super_base_option);
  if (local_5b8 != local_5a8) {
    operator_delete(local_5b8);
  }
  pcVar6 = local_788;
  local_350.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cd238;
  if (local_350.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_350.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_350.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_350.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_350.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._M_dataplus._M_p != &local_410.field_2) {
    operator_delete(local_410._M_dataplus._M_p);
  }
  local_210.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cd238;
  if (local_210.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_210.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_210.super_base_option);
  if (local_750 != local_740) {
    operator_delete(local_750);
  }
  local_3f0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cd238;
  if (local_3f0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3f0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_3f0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3f0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_3f0.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6f0._M_dataplus._M_p != &local_6f0.field_2) {
    operator_delete(local_6f0._M_dataplus._M_p);
  }
  local_170.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cd0f0;
  if (local_170.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_170.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_170.super_base_option);
  if (local_730 != local_720) {
    operator_delete(local_730);
  }
  local_658._0_8_ = &PTR__typed_option_002cd0f0;
  if (local_5c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_5c0._M_pi);
  }
  if (local_5d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_5d0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_658);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6d0._M_dataplus._M_p != &local_6d0.field_2) {
    operator_delete(local_6d0._M_dataplus._M_p);
  }
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cd200;
  if (local_d0.m_default_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_d0.m_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if (local_710 != local_700) {
    operator_delete(local_710);
  }
  local_598._0_8_ = &PTR__typed_option_002cd200;
  if (local_500._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_500._M_pi);
  }
  if (local_510._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_510._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_598);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6b0._M_dataplus._M_p != &local_6b0.field_2) {
    operator_delete(local_6b0._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_690);
  pp_Var1 = (_func_int **)(local_598 + 0x10);
  local_598._16_4_ = 0x66696263;
  local_598._20_2_ = 0x79;
  local_598._8_8_ = (pointer)0x5;
  local_598._0_8_ = pp_Var1;
  iVar5 = (*options->_vptr_options_i[1])(options,local_598);
  if ((_func_int **)local_598._0_8_ != pp_Var1) {
    operator_delete((void *)local_598._0_8_);
  }
  if ((char)iVar5 == '\0') {
    plVar11 = (learner<cbify,_example> *)0x0;
    goto LAB_001c4ebe;
  }
  local_598._16_4_ = 0x655f6263;
  local_598._20_2_ = 0x7078;
  local_598[0x16] = 0x6c;
  local_598[0x17] = 0x6f;
  local_598[0x18] = 'r';
  local_598[0x19] = 'e';
  local_598[0x1a] = '_';
  local_598[0x1b] = 'a';
  local_598._28_2_ = 0x6664;
  local_598._8_8_ = (pointer)0xe;
  local_598[0x1e] = '\0';
  local_598._0_8_ = pp_Var1;
  iVar5 = (*options->_vptr_options_i[1])(options);
  bVar4 = (byte)iVar5;
  pcVar6->use_adf = (bool)bVar4;
  if ((_func_int **)local_598._0_8_ == pp_Var1) {
    pcVar6->app_seed = 0x337ad8c;
    (pcVar6->a_s)._begin = (action_score *)0x0;
    (pcVar6->a_s)._end = (action_score *)0x0;
    (pcVar6->a_s).end_array = (action_score *)0x0;
    (pcVar6->a_s).erase_count = 0;
    pcVar6->all = local_7a0;
  }
  else {
    operator_delete((void *)local_598._0_8_);
    bVar4 = pcVar6->use_adf & 1;
    pcVar6->app_seed = 0x337ad8c;
    (pcVar6->a_s)._begin = (action_score *)0x0;
    (pcVar6->a_s)._end = (action_score *)0x0;
    (pcVar6->a_s).end_array = (action_score *)0x0;
    (pcVar6->a_s).erase_count = 0;
    pcVar6->all = local_7a0;
  }
  if (bVar4 != 0) {
    init_adf_data(pcVar6,(ulong)local_794);
  }
  local_598._16_4_ = 0x655f6263;
  local_598._20_2_ = 0x7078;
  local_598[0x16] = 0x6c;
  local_598[0x17] = 0x6f;
  local_598[0x18] = 'r';
  local_598[0x19] = 'e';
  local_598._8_8_ = (pointer)0xa;
  local_598[0x1a] = '\0';
  local_598._0_8_ = pp_Var1;
  iVar5 = (*options->_vptr_options_i[1])(options);
  if ((char)iVar5 == '\0') {
    bVar2 = pcVar6->use_adf;
    if ((_func_int **)local_598._0_8_ != pp_Var1) {
      operator_delete((void *)local_598._0_8_);
    }
    if (bVar2 == false) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_598);
      std::ostream::_M_insert<unsigned_long>((ulong)(local_598 + 0x10));
      local_658._16_5_ = 0x78655f6263;
      local_658._21_3_ = 0x6f6c70;
      local_640._M_allocated_capacity._0_2_ = 0x6572;
      local_658._8_8_ = (pointer)0xa;
      local_640._M_local_buf[2] = '\0';
      local_658._0_8_ = local_658 + 0x10;
      std::__cxx11::stringbuf::str();
      (*options->_vptr_options_i[5])(options,local_658,&local_3f0);
      if (local_3f0.super_base_option._vptr_base_option !=
          (_func_int **)&local_3f0.super_base_option.m_name._M_string_length) {
        operator_delete(local_3f0.super_base_option._vptr_base_option);
      }
      if ((undefined1 *)local_658._0_8_ != local_658 + 0x10) {
        operator_delete((void *)local_658._0_8_);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_598);
      std::ios_base::~ios_base(local_518);
    }
  }
  else if ((_func_int **)local_598._0_8_ != pp_Var1) {
    operator_delete((void *)local_598._0_8_);
  }
  if (pcVar6->use_adf == true) {
    local_598._16_4_ = 0x6d5f6263;
    local_598._20_2_ = 0x6e69;
    local_598[0x16] = 0x5f;
    local_598[0x17] = 99;
    local_598[0x18] = 'o';
    local_598[0x19] = 's';
    local_598[0x1a] = 't';
    local_598._8_8_ = (pointer)0xb;
    local_598[0x1b] = '\0';
    local_598._0_8_ = pp_Var1;
    __gnu_cxx::__to_xstring<std::__cxx11::string,char>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_658,
               vsnprintf,0x3a,"%f",(double)*local_790);
    (*options->_vptr_options_i[5])(options,local_598,local_658);
    if ((undefined1 *)local_658._0_8_ != local_658 + 0x10) {
      operator_delete((void *)local_658._0_8_);
    }
    if ((_func_int **)local_598._0_8_ != pp_Var1) {
      operator_delete((void *)local_598._0_8_);
    }
    local_598._16_4_ = 0x6d5f6263;
    local_598._20_2_ = 0x7861;
    local_598[0x16] = 0x5f;
    local_598[0x17] = 99;
    local_598[0x18] = 'o';
    local_598[0x19] = 's';
    local_598[0x1a] = 't';
    local_598._8_8_ = (pointer)0xb;
    local_598[0x1b] = '\0';
    local_598._0_8_ = pp_Var1;
    __gnu_cxx::__to_xstring<std::__cxx11::string,char>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_658,
               vsnprintf,0x3a,"%f",(double)*local_760);
    (*options->_vptr_options_i[5])(options,local_598,local_658);
    if ((undefined1 *)local_658._0_8_ != local_658 + 0x10) {
      operator_delete((void *)local_658._0_8_);
    }
    if ((_func_int **)local_598._0_8_ != pp_Var1) {
      operator_delete((void *)local_598._0_8_);
    }
  }
  local_598._16_4_ = 0x65736162;
  local_598._20_2_ = 0x696c;
  local_598[0x16] = 0x6e;
  local_598[0x17] = 0x65;
  local_598._8_8_ = (pointer)0x8;
  local_598[0x18] = '\0';
  local_598._0_8_ = pp_Var1;
  iVar5 = (*options->_vptr_options_i[1])(options);
  if ((_func_int **)local_598._0_8_ != pp_Var1) {
    operator_delete((void *)local_598._0_8_);
  }
  if ((char)iVar5 != '\0') {
    std::__cxx11::stringstream::stringstream((stringstream *)local_598);
    fVar17 = ABS(*local_790);
    fVar18 = ABS(local_790[1]);
    if (fVar18 <= fVar17) {
      fVar18 = fVar17;
    }
    std::ostream::_M_insert<double>((double)(fVar18 / (local_790[1] - *local_790)));
    local_658._16_5_ = 0x756d5f726c;
    local_658._21_3_ = 0x69746c;
    local_640._M_allocated_capacity._0_2_ = 0x6c70;
    local_640._M_local_buf[2] = 'i';
    local_640._M_allocated_capacity._3_2_ = 0x7265;
    local_658._8_8_ = (pointer)0xd;
    local_640._M_local_buf[5] = '\0';
    local_658._0_8_ = local_658 + 0x10;
    std::__cxx11::stringbuf::str();
    (*options->_vptr_options_i[5])(options,local_658,&local_3f0);
    if (local_3f0.super_base_option._vptr_base_option !=
        (_func_int **)&local_3f0.super_base_option.m_name._M_string_length) {
      operator_delete(local_3f0.super_base_option._vptr_base_option);
    }
    if ((undefined1 *)local_658._0_8_ != local_658 + 0x10) {
      operator_delete((void *)local_658._0_8_);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_598);
    std::ios_base::~ios_base(local_518);
  }
  if (pcVar6->use_adf == true) {
    pbVar10 = setup_base(options,local_7a0);
    base = LEARNER::as_multiline<char,char>(pbVar10);
    ppVar15 = local_7a0->p;
    if (local_7a1 == true) {
      plVar11 = LEARNER::learner<cbify,example>::
                init_learner<LEARNER::learner<char,std::vector<example*,std::allocator<example*>>>>
                          (pcVar6,base,predict_or_learn_adf<true,true>,
                           predict_or_learn_adf<false,true>,1,multiclass);
      goto LAB_001c4def;
    }
    plVar11 = LEARNER::learner<cbify,example>::
              init_learner<LEARNER::learner<char,std::vector<example*,std::allocator<example*>>>>
                        (pcVar6,base,predict_or_learn_adf<true,false>,
                         predict_or_learn_adf<false,false>,1,multiclass);
LAB_001c4e61:
    *(undefined8 *)(plVar11 + 0x58) = *(undefined8 *)(plVar11 + 0x18);
    *(code **)(plVar11 + 0x68) = MULTICLASS::finish_example<cbify>;
    ppuVar13 = &MULTICLASS::mc_label;
  }
  else {
    pbVar10 = setup_base(options,local_7a0);
    base_00 = LEARNER::as_singleline<char,char>(pbVar10);
    ppVar15 = local_7a0->p;
    if (local_7a1 != true) {
      plVar11 = LEARNER::learner<cbify,example>::init_learner<LEARNER::learner<char,example>>
                          (pcVar6,base_00,predict_or_learn<true,false>,predict_or_learn<false,false>
                           ,1,multiclass);
      goto LAB_001c4e61;
    }
    plVar11 = LEARNER::learner<cbify,example>::init_learner<LEARNER::learner<char,example>>
                        (pcVar6,base_00,predict_or_learn<true,true>,predict_or_learn<false,true>,1,
                         multiclass);
LAB_001c4def:
    *(undefined8 *)(plVar11 + 0x58) = *(undefined8 *)(plVar11 + 0x18);
    *(code **)(plVar11 + 0x68) = COST_SENSITIVE::finish_example<cbify>;
    ppuVar13 = &COST_SENSITIVE::cs_label;
  }
  plVar14 = &ppVar15->lp;
  for (lVar12 = 9; lVar12 != 0; lVar12 = lVar12 + -1) {
    plVar14->default_label = (_func_void_void_ptr *)*ppuVar13;
    ppuVar13 = ppuVar13 + (ulong)bVar16 * -2 + 1;
    plVar14 = (label_parser *)((long)plVar14 + (ulong)bVar16 * -0x10 + 8);
  }
  *(undefined8 *)(plVar11 + 0xb8) = *(undefined8 *)(plVar11 + 0x18);
  *(undefined8 *)(plVar11 + 0xc0) = *(undefined8 *)(plVar11 + 0x20);
  *(code **)(plVar11 + 200) = finish;
  local_7a0->delete_prediction = (_func_void_void_ptr *)0x0;
  pcVar6 = (cbify *)0x0;
LAB_001c4ebe:
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_690.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_690.m_name._M_dataplus._M_p != &local_690.m_name.field_2) {
    operator_delete(local_690.m_name._M_dataplus._M_p);
  }
  if (pcVar6 != (cbify *)0x0) {
    destroy_free<cbify>(pcVar6);
  }
  return (base_learner *)plVar11;
}

Assistant:

base_learner* cbify_setup(options_i& options, vw& all)
{
  uint32_t num_actions = 0;
  auto data = scoped_calloc_or_throw<cbify>();
  bool use_cs;

  option_group_definition new_options("Make Multiclass into Contextual Bandit");
  new_options
      .add(make_option("cbify", num_actions)
               .keep()
               .help("Convert multiclass on <k> classes into a contextual bandit problem"))
      .add(make_option("cbify_cs", use_cs).help("consume cost-sensitive classification examples instead of multiclass"))
      .add(make_option("loss0", data->loss0).default_value(0.f).help("loss for correct label"))
      .add(make_option("loss1", data->loss1).default_value(1.f).help("loss for incorrect label"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("cbify"))
    return nullptr;

  data->use_adf = options.was_supplied("cb_explore_adf");
  data->app_seed = uniform_hash("vw", 2, 0);
  data->a_s = v_init<action_score>();
  data->all = &all;

  if (data->use_adf)
    init_adf_data(*data.get(), num_actions);

  if (!options.was_supplied("cb_explore") && !data->use_adf)
  {
    stringstream ss;
    ss << num_actions;
    options.insert("cb_explore", ss.str());
  }

  if (data->use_adf)
  {
    options.insert("cb_min_cost", to_string(data->loss0));
    options.insert("cb_max_cost", to_string(data->loss1));
  }

  if (options.was_supplied("baseline"))
  {
    stringstream ss;
    ss << max<float>(abs(data->loss0), abs(data->loss1)) / (data->loss1 - data->loss0);
    options.insert("lr_multiplier", ss.str());
  }

  learner<cbify, example>* l;

  if (data->use_adf)
  {
    multi_learner* base = as_multiline(setup_base(options, all));
    if (use_cs)
      l = &init_cost_sensitive_learner(
          data, base, predict_or_learn_adf<true, true>, predict_or_learn_adf<false, true>, all.p, 1);
    else
      l = &init_multiclass_learner(
          data, base, predict_or_learn_adf<true, false>, predict_or_learn_adf<false, false>, all.p, 1);
  }
  else
  {
    single_learner* base = as_singleline(setup_base(options, all));
    if (use_cs)
      l = &init_cost_sensitive_learner(
          data, base, predict_or_learn<true, true>, predict_or_learn<false, true>, all.p, 1);
    else
      l = &init_multiclass_learner(data, base, predict_or_learn<true, false>, predict_or_learn<false, false>, all.p, 1);
  }
  l->set_finish(finish);
  all.delete_prediction = nullptr;

  return make_base(*l);
}